

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

positionTy * __thiscall positionTy::LocalToWorld(positionTy *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  positionTy *in_RDI;
  
  if ((SUB21(in_RDI->f,1) >> 2 & 1) == 1) {
    pdVar4 = X((positionTy *)0x12ed05);
    dVar1 = *pdVar4;
    pdVar4 = Y((positionTy *)0x12ed18);
    dVar2 = *pdVar4;
    pdVar4 = Z((positionTy *)0x12ed2c);
    dVar3 = *pdVar4;
    pdVar4 = lat(in_RDI);
    pdVar5 = lon(in_RDI);
    pdVar6 = alt_m(in_RDI);
    XPLMLocalToWorld(dVar1,dVar2,dVar3,pdVar4,pdVar5,pdVar6);
    in_RDI->f = (posFlagsTy)((ushort)in_RDI->f & 0xfbff);
  }
  return in_RDI;
}

Assistant:

positionTy& positionTy::LocalToWorld()
{
    if (f.unitCoord == UNIT_LOCAL) {
        XPLMLocalToWorld(X(), Y(), Z(),
                         &lat(), &lon(), &alt_m());
        f.unitCoord = UNIT_WORLD;
    }
    return *this;
}